

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.cpp
# Opt level: O0

optional<unsigned_char> __thiscall
Storage::Tape::ZXSpectrum::Parser::get_byte(Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  bool bVar1;
  SymbolType SVar2;
  int local_28;
  SymbolType symbol;
  int c;
  uint8_t result;
  shared_ptr<Storage::Tape::Tape> *tape_local;
  Parser *this_local;
  
  symbol._3_1_ = Zero >> 0x18;
  local_28 = 0;
  _c = tape;
  tape_local = (shared_ptr<Storage::Tape::Tape> *)this;
  while( true ) {
    if (7 < local_28) {
      bVar1 = should_flip_bytes(this);
      if (bVar1) {
        symbol._3_1_ = CRC::reverse_byte(symbol._3_1_);
      }
      this->checksum_ = this->checksum_ ^ symbol._3_1_;
      std::optional<unsigned_char>::optional<unsigned_char,_true>
                ((optional<unsigned_char> *)((long)&this_local + 6),(byte *)((long)&symbol + 3));
      return (_Optional_base<unsigned_char,_true,_true>)
             (_Optional_base<unsigned_char,_true,_true>)this_local._6_2_;
    }
    SVar2 = Parser<Storage::Tape::ZXSpectrum::SymbolType>::get_next_symbol
                      ((Parser<Storage::Tape::ZXSpectrum::SymbolType> *)this,_c);
    if ((SVar2 != One) && (SVar2 != Zero)) break;
    symbol._3_1_ = symbol._3_1_ << 1 | SVar2 == One;
    local_28 = local_28 + 1;
  }
  std::optional<unsigned_char>::optional((optional<unsigned_char> *)((long)&this_local + 6));
  return (optional<unsigned_char>)this_local._6_2_;
}

Assistant:

std::optional<uint8_t> Parser::get_byte(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	uint8_t result = 0;
	for(int c = 0; c < 8; c++) {
		const SymbolType symbol = get_next_symbol(tape);
		if(symbol != SymbolType::One && symbol != SymbolType::Zero) return std::nullopt;
		result = uint8_t((result << 1) | (symbol == SymbolType::One));
	}

	if(should_flip_bytes()) {
		result = CRC::reverse_byte(result);
	}

	checksum_ ^= result;
	return result;
}